

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O3

void run_andnot_test(void)

{
  _Bool _Var1;
  int iVar2;
  array_container_t *container;
  array_container_t *container_00;
  array_container_t *container_01;
  array_container_t *container_02;
  array_container_t *container_03;
  bitset_container_t *src_2;
  bitset_container_t *src_2_00;
  bitset_container_t *src_2_01;
  bitset_container_t *src_1;
  bitset_container_t *bitset;
  run_container_t *run;
  run_container_t *run_00;
  run_container_t *run_01;
  run_container_t *run_02;
  unsigned_long uVar3;
  array_container_t *container_04;
  run_container_t *prVar4;
  array_container_t *container_05;
  uint16_t *puVar5;
  ushort uVar6;
  long lVar7;
  int32_t iVar8;
  ushort uVar9;
  int x;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  int i;
  int iVar15;
  ulong uVar16;
  bool bVar17;
  container_t *BM_1;
  array_container_t *local_40;
  run_container_t *local_38;
  
  container = array_container_create();
  container_00 = array_container_create();
  container_01 = array_container_create();
  container_02 = array_container_create();
  container_03 = array_container_create();
  src_2 = bitset_container_create();
  src_2_00 = bitset_container_create();
  src_2_01 = bitset_container_create();
  src_1 = bitset_container_create();
  bitset = bitset_container_create();
  run = run_container_create();
  run_00 = run_container_create();
  run_01 = run_container_create();
  uVar12 = 0;
  run_02 = run_container_create();
  do {
    uVar6 = (ushort)uVar12;
    if ((ushort)(uVar6 + (short)(((uint)uVar12 & 0xffff) / 5) * -5) < 3) {
      iVar2 = container->cardinality;
      if (((long)iVar2 == 0) ||
         ((puVar5 = container->array, iVar2 != 0x7fffffff && (puVar5[(long)iVar2 + -1] < uVar6)))) {
        if (iVar2 == container->capacity) {
          array_container_grow(container,iVar2 + 1,true);
          iVar2 = container->cardinality;
        }
        container->cardinality = iVar2 + 1;
        container->array[iVar2] = uVar6;
      }
      else {
        if (iVar2 < 1) {
          uVar16 = 0;
        }
        else {
          iVar15 = iVar2 + -1;
          uVar16 = 0;
          do {
            uVar11 = iVar15 + (int)uVar16;
            uVar10 = uVar11 >> 1;
            uVar9 = *(ushort *)((long)puVar5 + (ulong)(uVar11 & 0xfffffffe));
            if (uVar9 < uVar6) {
              uVar16 = (ulong)(uVar10 + 1);
            }
            else {
              if (uVar9 <= uVar6) goto LAB_00105f2a;
              iVar15 = uVar10 - 1;
            }
          } while ((int)uVar16 <= iVar15);
          if (iVar2 == 0x7fffffff) goto LAB_00105f2a;
        }
        if (iVar2 == container->capacity) {
          array_container_grow(container,iVar2 + 1,true);
          puVar5 = container->array;
        }
        memmove(puVar5 + uVar16 + 1,puVar5 + uVar16,(long)(iVar2 - (int)uVar16) * 2);
        container->array[uVar16] = uVar6;
        container->cardinality = container->cardinality + 1;
      }
LAB_00105f2a:
      uVar16 = src_2->words[uVar12 >> 6];
      uVar14 = uVar16 | 1L << (uVar12 & 0x3f);
      src_2->cardinality = src_2->cardinality + (int)((uVar16 ^ uVar14) >> ((byte)uVar12 & 0x3f));
      src_2->words[uVar12 >> 6] = uVar14;
      run_container_add(run,uVar6);
    }
    uVar10 = (uint)uVar12 + 1;
    uVar12 = (ulong)uVar10;
  } while (uVar10 != 0x10000);
  uVar12 = 0;
  do {
    uVar6 = (ushort)uVar12;
    uVar10 = (uint)((uVar12 & 0xffff) >> 1) / 0x1f;
    if ((ushort)(((short)uVar10 * 2 - (short)(uVar10 << 6)) + uVar6) < 0x25) {
      iVar2 = container_00->cardinality;
      if (((long)iVar2 == 0) ||
         ((puVar5 = container_00->array, iVar2 != 0x7fffffff && (puVar5[(long)iVar2 + -1] < uVar6)))
         ) {
        if (iVar2 == container_00->capacity) {
          array_container_grow(container_00,iVar2 + 1,true);
          iVar2 = container_00->cardinality;
        }
        container_00->cardinality = iVar2 + 1;
        container_00->array[iVar2] = uVar6;
      }
      else {
        if (iVar2 < 1) {
          uVar16 = 0;
        }
        else {
          iVar15 = iVar2 + -1;
          uVar16 = 0;
          do {
            uVar11 = iVar15 + (int)uVar16;
            uVar10 = uVar11 >> 1;
            uVar9 = *(ushort *)((long)puVar5 + (ulong)(uVar11 & 0xfffffffe));
            if (uVar9 < uVar6) {
              uVar16 = (ulong)(uVar10 + 1);
            }
            else {
              if (uVar9 <= uVar6) goto LAB_0010606e;
              iVar15 = uVar10 - 1;
            }
          } while ((int)uVar16 <= iVar15);
          if (iVar2 == 0x7fffffff) goto LAB_0010606e;
        }
        if (iVar2 == container_00->capacity) {
          array_container_grow(container_00,iVar2 + 1,true);
          puVar5 = container_00->array;
        }
        memmove(puVar5 + uVar16 + 1,puVar5 + uVar16,(long)(iVar2 - (int)uVar16) * 2);
        container_00->array[uVar16] = uVar6;
        container_00->cardinality = container_00->cardinality + 1;
      }
LAB_0010606e:
      uVar16 = src_2_00->words[uVar12 >> 6];
      uVar14 = uVar16 | 1L << (uVar12 & 0x3f);
      src_2_00->cardinality =
           src_2_00->cardinality + (int)((uVar16 ^ uVar14) >> ((byte)uVar12 & 0x3f));
      src_2_00->words[uVar12 >> 6] = uVar14;
      run_container_add(run_00,uVar6);
    }
    uVar10 = (int)uVar12 + 1;
    uVar12 = (ulong)uVar10;
  } while (uVar10 != 0x10000);
  uVar12 = 0;
  do {
    uVar6 = (ushort)uVar12;
    uVar10 = (uint)uVar12 & 0xffff;
    if (((ushort)(uVar6 + (short)(uVar10 / 5) * -5) < 3) &&
       (uVar10 = uVar10 / 0x3e, 0x24 < (ushort)(((short)uVar10 * 2 - (short)(uVar10 << 6)) + uVar6))
       ) {
      iVar2 = container_03->cardinality;
      if (((long)iVar2 == 0) ||
         ((puVar5 = container_03->array, iVar2 != 0x7fffffff && (puVar5[(long)iVar2 + -1] < uVar6)))
         ) {
        if (iVar2 == container_03->capacity) {
          array_container_grow(container_03,iVar2 + 1,true);
          iVar2 = container_03->cardinality;
        }
        container_03->cardinality = iVar2 + 1;
        container_03->array[iVar2] = uVar6;
      }
      else {
        if (iVar2 < 1) {
          uVar16 = 0;
        }
        else {
          iVar15 = iVar2 + -1;
          uVar16 = 0;
          do {
            uVar11 = iVar15 + (int)uVar16;
            uVar10 = uVar11 >> 1;
            uVar9 = *(ushort *)((long)puVar5 + (ulong)(uVar11 & 0xfffffffe));
            if (uVar9 < uVar6) {
              uVar16 = (ulong)(uVar10 + 1);
            }
            else {
              if (uVar9 <= uVar6) goto LAB_001061d2;
              iVar15 = uVar10 - 1;
            }
          } while ((int)uVar16 <= iVar15);
          if (iVar2 == 0x7fffffff) goto LAB_001061d2;
        }
        if (iVar2 == container_03->capacity) {
          array_container_grow(container_03,iVar2 + 1,true);
          puVar5 = container_03->array;
        }
        memmove(puVar5 + uVar16 + 1,puVar5 + uVar16,(long)(iVar2 - (int)uVar16) * 2);
        container_03->array[uVar16] = uVar6;
        container_03->cardinality = container_03->cardinality + 1;
      }
LAB_001061d2:
      uVar16 = bitset->words[uVar12 >> 6];
      uVar14 = uVar16 | 1L << (uVar12 & 0x3f);
      bitset->cardinality = bitset->cardinality + (int)((uVar16 ^ uVar14) >> ((byte)uVar12 & 0x3f));
      bitset->words[uVar12 >> 6] = uVar14;
    }
    uVar10 = (uint)uVar12 + 1;
    uVar12 = (ulong)uVar10;
  } while (uVar10 != 0x10000);
  uVar12 = 0;
  do {
    uVar9 = (ushort)uVar12;
    uVar10 = (uint)uVar12;
    uVar6 = uVar9 + (short)((uVar10 & 0xffff) / 5) * -5;
    if ((uVar6 < 2) || (10000 < uVar10 && uVar6 == 2)) {
      iVar2 = container_01->cardinality;
      if (((long)iVar2 == 0) ||
         ((puVar5 = container_01->array, iVar2 != 0x7fffffff && (puVar5[(long)iVar2 + -1] < uVar9)))
         ) {
        if (iVar2 == container_01->capacity) {
          array_container_grow(container_01,iVar2 + 1,true);
          iVar2 = container_01->cardinality;
        }
        container_01->cardinality = iVar2 + 1;
        container_01->array[iVar2] = uVar9;
      }
      else {
        if (iVar2 < 1) {
          uVar16 = 0;
        }
        else {
          iVar15 = iVar2 + -1;
          uVar16 = 0;
          do {
            uVar13 = iVar15 + (int)uVar16;
            uVar11 = uVar13 >> 1;
            uVar6 = *(ushort *)((long)puVar5 + (ulong)(uVar13 & 0xfffffffe));
            if (uVar6 < uVar9) {
              uVar16 = (ulong)(uVar11 + 1);
            }
            else {
              if (uVar6 <= uVar9) goto LAB_0010631f;
              iVar15 = uVar11 - 1;
            }
          } while ((int)uVar16 <= iVar15);
          if (iVar2 == 0x7fffffff) goto LAB_0010631f;
        }
        if (iVar2 == container_01->capacity) {
          array_container_grow(container_01,iVar2 + 1,true);
          puVar5 = container_01->array;
        }
        memmove(puVar5 + uVar16 + 1,puVar5 + uVar16,(long)(iVar2 - (int)uVar16) * 2);
        container_01->array[uVar16] = uVar9;
        container_01->cardinality = container_01->cardinality + 1;
      }
LAB_0010631f:
      uVar16 = src_2_01->words[uVar12 >> 6];
      uVar14 = uVar16 | 1L << (uVar12 & 0x3f);
      src_2_01->cardinality =
           src_2_01->cardinality + (int)((uVar16 ^ uVar14) >> ((byte)uVar12 & 0x3f));
      src_2_01->words[uVar12 >> 6] = uVar14;
      run_container_add(run_01,uVar9);
    }
    uVar12 = (ulong)(uVar10 + 1);
  } while (uVar10 + 1 != 0x10000);
  uVar12 = 0;
  uVar10 = 1;
  do {
    if ((uVar10 & 3) != 0) {
      uVar6 = (ushort)uVar12;
      run_container_add(run_02,uVar6);
      iVar2 = container_02->cardinality;
      if (((long)iVar2 == 0) ||
         ((puVar5 = container_02->array, iVar2 != 0x7fffffff && (puVar5[(long)iVar2 + -1] < uVar6)))
         ) {
        if (iVar2 == container_02->capacity) {
          array_container_grow(container_02,iVar2 + 1,true);
          iVar2 = container_02->cardinality;
        }
        container_02->cardinality = iVar2 + 1;
        container_02->array[iVar2] = uVar6;
      }
      else {
        if (iVar2 < 1) {
          uVar11 = 0;
        }
        else {
          iVar15 = iVar2 + -1;
          uVar11 = 0;
          do {
            uVar13 = iVar15 + uVar11 >> 1;
            uVar9 = *(ushort *)((long)puVar5 + (ulong)(iVar15 + uVar11 & 0xfffffffe));
            if (uVar9 < uVar6) {
              uVar11 = uVar13 + 1;
            }
            else {
              if (uVar9 <= uVar6) goto LAB_0010646b;
              iVar15 = uVar13 - 1;
            }
          } while ((int)uVar11 <= iVar15);
          if (iVar2 == 0x7fffffff) goto LAB_0010646b;
        }
        if (iVar2 == container_02->capacity) {
          array_container_grow(container_02,iVar2 + 1,true);
          puVar5 = container_02->array;
        }
        memmove(puVar5 + (ulong)uVar11 + 1,puVar5 + uVar11,(long)(int)(iVar2 - uVar11) * 2);
        container_02->array[uVar11] = uVar6;
        container_02->cardinality = container_02->cardinality + 1;
      }
LAB_0010646b:
      uVar16 = src_1->words[uVar12 >> 6];
      uVar14 = uVar16 | 1L << (uVar12 & 0x3f);
      src_1->cardinality = src_1->cardinality + (int)((uVar16 ^ uVar14) >> ((byte)uVar12 & 0x3f));
      src_1->words[uVar12 >> 6] = uVar14;
    }
    uVar10 = (uVar10 * 0xd68 + 0x1a85) % 0x26f5;
    uVar11 = (int)uVar12 + 1;
    uVar12 = (ulong)uVar11;
  } while (uVar11 != 0x10000);
  uVar3 = (unsigned_long)container_03->cardinality;
  local_40 = (array_container_t *)0x0;
  _Var1 = run_bitset_container_andnot(run,src_2,&local_40);
  _assert_true((ulong)!_Var1,"run_bitset_container_andnot(R1, B1, &BM_1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x2dd);
  _assert_int_equal(0,(long)local_40->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x2de);
  array_container_free(local_40);
  local_40 = (array_container_t *)0x0;
  array_run_container_andnot(container,run,container_03);
  _assert_int_equal(0,(long)container_03->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x2e3);
  iVar2 = run_run_container_andnot(run,run,&local_40);
  _assert_int_equal(3,(long)iVar2,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x2e8);
  iVar2 = run_container_cardinality((run_container_t *)local_40);
  _assert_int_equal(0,(long)iVar2,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x2e9);
  run_container_free((run_container_t *)local_40);
  local_40 = (array_container_t *)0x0;
  _Var1 = run_bitset_container_andnot(run,src_2_01,&local_40);
  _assert_true((ulong)!_Var1,"run_bitset_container_andnot(R1, B3, &BM_1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x2ed);
  _assert_int_equal(2000,(long)local_40->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x2ee);
  array_container_free(local_40);
  local_40 = (array_container_t *)0x0;
  _Var1 = bitset_run_container_andnot(src_2,run_01,&local_40);
  _assert_true((ulong)!_Var1,"bitset_run_container_andnot(B1, R3, &BM_1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x2f2);
  _assert_int_equal(2000,(long)local_40->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x2f3);
  array_container_free(local_40);
  local_40 = (array_container_t *)0x0;
  array_run_container_andnot(container,run_01,container_03);
  _assert_int_equal(2000,(long)container_03->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x2f8);
  iVar2 = run_array_container_andnot(run,container_01,&local_40);
  _assert_int_equal(2,(long)iVar2,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x2fb);
  _assert_int_equal(2000,(long)local_40->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x2fc);
  array_container_free(local_40);
  local_40 = (array_container_t *)0x0;
  iVar2 = run_run_container_andnot(run,run_01,&local_40);
  _assert_int_equal(2,(long)iVar2,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x301);
  _assert_int_equal(2000,(long)local_40->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x302);
  array_container_free(local_40);
  local_40 = (array_container_t *)0x0;
  _Var1 = run_bitset_container_andnot(run,src_2_00,&local_40);
  _assert_true((ulong)_Var1,"run_bitset_container_andnot(R1, B2, &BM_1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x306);
  _assert_int_equal(uVar3,(long)local_40->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x307);
  bitset_container_free((bitset_container_t *)local_40);
  local_40 = (array_container_t *)0x0;
  array_run_container_andnot(container,run_00,container_03);
  _assert_int_equal(uVar3,(long)container_03->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x30c);
  container_04 = array_container_create();
  iVar8 = container_04->cardinality;
  iVar2 = 0x3de;
  do {
    uVar6 = (ushort)iVar2;
    if ((iVar8 == 0) ||
       ((puVar5 = container_04->array, iVar8 != 0x7fffffff && (puVar5[(long)iVar8 + -1] < uVar6))))
    {
      if (iVar8 == container_04->capacity) {
        array_container_grow(container_04,iVar8 + 1,true);
        iVar8 = container_04->cardinality;
      }
      container_04->cardinality = iVar8 + 1;
      container_04->array[iVar8] = uVar6;
      iVar15 = iVar8 + 1;
    }
    else {
      if (iVar8 < 1) {
        uVar12 = 0;
      }
      else {
        iVar15 = iVar8 + -1;
        uVar12 = 0;
        do {
          uVar11 = iVar15 + (int)uVar12;
          uVar10 = uVar11 >> 1;
          uVar9 = *(ushort *)((long)puVar5 + (ulong)(uVar11 & 0xfffffffe));
          if (uVar9 < uVar6) {
            uVar12 = (ulong)(uVar10 + 1);
          }
          else {
            iVar15 = iVar8;
            if (uVar9 <= uVar6) goto LAB_00106865;
            iVar15 = uVar10 - 1;
          }
        } while ((int)uVar12 <= iVar15);
        iVar15 = 0x7fffffff;
        if (iVar8 == 0x7fffffff) goto LAB_00106865;
      }
      if (iVar8 == container_04->capacity) {
        array_container_grow(container_04,iVar8 + 1,true);
        puVar5 = container_04->array;
      }
      memmove(puVar5 + uVar12 + 1,puVar5 + uVar12,(long)(iVar8 - (int)uVar12) * 2);
      container_04->array[uVar12] = uVar6;
      iVar15 = container_04->cardinality + 1;
      container_04->cardinality = iVar15;
    }
LAB_00106865:
    iVar8 = iVar15;
    iVar2 = iVar2 + 1;
  } while (iVar2 != 1000);
  iVar2 = -10;
  prVar4 = run_container_create();
  do {
    run_container_add(prVar4,(short)iVar2 + 1000);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0);
  array_run_container_andnot(container_04,run_00,container_03);
  _assert_int_equal(2,(long)container_03->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x316);
  _Var1 = run_bitset_container_andnot(prVar4,src_2_00,&local_40);
  _assert_true((ulong)!_Var1,"run_bitset_container_andnot(R_small, B2, &BM_1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x318);
  _assert_int_equal(2,(long)local_40->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x319);
  array_container_free(local_40);
  iVar15 = 0;
  local_40 = (array_container_t *)0x0;
  local_38 = prVar4;
  iVar2 = run_array_container_andnot(prVar4,container_00,&local_40);
  _assert_int_equal(3,(long)iVar2,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,799);
  iVar2 = run_container_cardinality((run_container_t *)local_40);
  _assert_int_equal(2,(long)iVar2,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,800);
  run_container_free((run_container_t *)local_40);
  local_40 = (array_container_t *)0x0;
  prVar4 = run_container_create();
  container_05 = array_container_create();
  do {
    run_container_add(prVar4,(uint16_t)iVar15);
    iVar15 = iVar15 + 1;
  } while (iVar15 != 3);
  iVar2 = -2;
  do {
    run_container_add(prVar4,(short)iVar2 + 0xc);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0);
  iVar2 = -5;
  do {
    run_container_add(prVar4,(short)iVar2 + 0x3e3);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0);
  iVar2 = -3;
  do {
    run_container_add(prVar4,(short)iVar2 + 0x2713);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0);
  iVar2 = -2;
  do {
    run_container_add(prVar4,(short)iVar2 + 0x4e22);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0);
  iVar8 = container_05->cardinality;
  if (((long)iVar8 == 0) ||
     ((puVar5 = container_05->array, iVar8 != 0x7fffffff && (puVar5[(long)iVar8 + -1] < 0x3e1)))) {
    if (iVar8 == container_05->capacity) {
      array_container_grow(container_05,iVar8 + 1,true);
      iVar8 = container_05->cardinality;
    }
    puVar5 = container_05->array;
    lVar7 = (long)iVar8;
    iVar8 = iVar8 + 1;
    container_05->cardinality = iVar8;
    puVar5[lVar7] = 0x3e1;
LAB_00106b14:
    if (iVar8 == 0) {
      iVar8 = 0;
    }
    else {
      bVar17 = iVar8 == 0x7fffffff;
      if ((bVar17) || (0x3e1 < puVar5[(long)iVar8 + -1])) {
        if (0 < iVar8) goto LAB_00106b3e;
        uVar12 = 0;
        goto LAB_00106bc3;
      }
    }
    if (iVar8 == container_05->capacity) {
      array_container_grow(container_05,iVar8 + 1,true);
      iVar8 = container_05->cardinality;
      puVar5 = container_05->array;
    }
    lVar7 = (long)iVar8;
    iVar8 = iVar8 + 1;
    container_05->cardinality = iVar8;
    puVar5[lVar7] = 0x3e2;
LAB_00106c17:
    if (iVar8 != 0) goto LAB_00106c1c;
    iVar8 = 0;
  }
  else {
    if (iVar8 < 1) {
      uVar12 = 0;
LAB_00106ac0:
      if (iVar8 == container_05->capacity) {
        array_container_grow(container_05,iVar8 + 1,true);
        puVar5 = container_05->array;
      }
      memmove(puVar5 + uVar12 + 1,puVar5 + uVar12,(long)(iVar8 - (int)uVar12) * 2);
      puVar5 = container_05->array;
      puVar5[uVar12] = 0x3e1;
      iVar8 = container_05->cardinality + 1;
      container_05->cardinality = iVar8;
      goto LAB_00106b14;
    }
    iVar2 = iVar8 + -1;
    uVar12 = 0;
    do {
      uVar11 = iVar2 + (int)uVar12;
      uVar10 = uVar11 >> 1;
      uVar6 = *(ushort *)((long)puVar5 + (ulong)(uVar11 & 0xfffffffe));
      if (uVar6 < 0x3e1) {
        uVar12 = (ulong)(uVar10 + 1);
      }
      else {
        if (uVar6 == 0x3e1) goto LAB_00106b14;
        iVar2 = uVar10 - 1;
      }
    } while ((int)uVar12 <= iVar2);
    if (iVar8 != 0x7fffffff) goto LAB_00106ac0;
    bVar17 = true;
    iVar8 = 0x7fffffff;
LAB_00106b3e:
    iVar2 = iVar8 + -1;
    uVar12 = 0;
    do {
      uVar11 = iVar2 + (int)uVar12;
      uVar10 = uVar11 >> 1;
      uVar6 = *(ushort *)((long)puVar5 + (ulong)(uVar11 & 0xfffffffe));
      if (uVar6 < 0x3e2) {
        uVar12 = (ulong)(uVar10 + 1);
      }
      else {
        if (uVar6 == 0x3e2) goto LAB_00106c1c;
        iVar2 = uVar10 - 1;
      }
    } while ((int)uVar12 <= iVar2);
    if (!bVar17) {
LAB_00106bc3:
      if (iVar8 == container_05->capacity) {
        array_container_grow(container_05,iVar8 + 1,true);
        puVar5 = container_05->array;
      }
      memmove(puVar5 + uVar12 + 1,puVar5 + uVar12,(long)(iVar8 - (int)uVar12) * 2);
      puVar5 = container_05->array;
      puVar5[uVar12] = 0x3e2;
      iVar8 = container_05->cardinality + 1;
      container_05->cardinality = iVar8;
      goto LAB_00106c17;
    }
LAB_00106c1c:
    if ((iVar8 == 0x7fffffff) || (1999 < puVar5[(long)iVar8 + -1])) {
      if (iVar8 < 1) {
        uVar10 = 0;
      }
      else {
        iVar2 = iVar8 + -1;
        uVar10 = 0;
        do {
          uVar11 = iVar2 + uVar10 >> 1;
          uVar6 = *(ushort *)((long)puVar5 + (ulong)(iVar2 + uVar10 & 0xfffffffe));
          if (uVar6 < 2000) {
            uVar10 = uVar11 + 1;
          }
          else {
            if (uVar6 == 2000) goto LAB_00106d13;
            iVar2 = uVar11 - 1;
          }
        } while ((int)uVar10 <= iVar2);
        if (iVar8 == 0x7fffffff) goto LAB_00106d13;
      }
      if (iVar8 == container_05->capacity) {
        array_container_grow(container_05,iVar8 + 1,true);
        puVar5 = container_05->array;
      }
      memmove(puVar5 + (ulong)uVar10 + 1,puVar5 + uVar10,(long)(int)(iVar8 - uVar10) * 2);
      container_05->array[uVar10] = 2000;
      container_05->cardinality = container_05->cardinality + 1;
      goto LAB_00106d13;
    }
  }
  if (iVar8 == container_05->capacity) {
    array_container_grow(container_05,iVar8 + 1,true);
    iVar8 = container_05->cardinality;
    puVar5 = container_05->array;
  }
  container_05->cardinality = iVar8 + 1;
  puVar5[iVar8] = 2000;
LAB_00106d13:
  iVar2 = run_array_container_andnot(prVar4,container_05,&local_40);
  _assert_int_equal(3,(long)iVar2,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x333);
  iVar2 = run_container_cardinality((run_container_t *)local_40);
  _assert_int_equal(0xd,(long)iVar2,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x334);
  array_container_free(local_40);
  local_40 = (array_container_t *)0x0;
  array_container_free(container_05);
  run_container_free(prVar4);
  iVar2 = run_array_container_andnot(run,container_01,&local_40);
  _assert_int_equal(2,(long)iVar2,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x33c);
  _assert_int_equal(2000,(long)local_40->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x33d);
  array_container_free(local_40);
  local_40 = (array_container_t *)0x0;
  iVar2 = run_run_container_andnot(run,run_00,&local_40);
  _assert_int_equal(1,(long)iVar2,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x342);
  _assert_int_equal(uVar3,(long)local_40->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x343);
  bitset_container_free((bitset_container_t *)local_40);
  local_40 = (array_container_t *)0x0;
  _Var1 = bitset_bitset_container_andnot(src_1,src_2_01,&local_40);
  _assert_true((ulong)_Var1,"bitset_bitset_container_andnot(B4, B3, &BM_1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x349);
  uVar3 = (unsigned_long)local_40->cardinality;
  bitset_container_free((bitset_container_t *)local_40);
  local_40 = (array_container_t *)0x0;
  _Var1 = run_bitset_container_andnot(run_02,src_2_01,&local_40);
  _assert_true((ulong)_Var1,"run_bitset_container_andnot(R4, B3, &BM_1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x34e);
  _assert_int_equal(uVar3,(long)local_40->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x34f);
  bitset_container_free((bitset_container_t *)local_40);
  local_40 = (array_container_t *)0x0;
  array_run_container_andnot(container_02,run_01,container_03);
  _assert_int_equal(uVar3,(long)container_03->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x355);
  iVar2 = run_run_container_andnot(run_02,run_01,&local_40);
  _assert_int_equal(1,(long)iVar2,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x358);
  _assert_int_equal(uVar3,(long)local_40->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x359);
  bitset_container_free((bitset_container_t *)local_40);
  local_40 = (array_container_t *)0x0;
  array_container_free(container);
  array_container_free(container_00);
  array_container_free(container_01);
  array_container_free(container_02);
  array_container_free(container_03);
  array_container_free(container_04);
  bitset_container_free(src_2);
  bitset_container_free(src_2_00);
  bitset_container_free(src_2_01);
  bitset_container_free(src_1);
  bitset_container_free(bitset);
  run_container_free(run);
  run_container_free(run_00);
  run_container_free(run_01);
  run_container_free(run_02);
  run_container_free(local_38);
  return;
}

Assistant:

DEFINE_TEST(run_andnot_test) {
    array_container_t* A1 = array_container_create();
    array_container_t* A2 = array_container_create();
    array_container_t* A3 = array_container_create();
    array_container_t* A4 = array_container_create();
    array_container_t* AM = array_container_create();
    bitset_container_t* B1 = bitset_container_create();
    bitset_container_t* B2 = bitset_container_create();
    bitset_container_t* B3 = bitset_container_create();
    bitset_container_t* B4 = bitset_container_create();
    bitset_container_t* BM = bitset_container_create();
    run_container_t* R1 = run_container_create();
    run_container_t* R2 = run_container_create();
    run_container_t* R3 = run_container_create();
    run_container_t* R4 = run_container_create();

    // B/A1 minus  R1 is empty (array or run, I guess)
    // B/A1 minus R2 is probably best left as runs
    // B/A3 minus R1 is best as an array.
    // B/A3 minus R4 is best as a bitmap

    // nb, array containers will be illegally big.
    for (int x = 0; x < (1 << 16); x++) {
        if (x % 5 < 3) {
            array_container_add(A1, x);
            bitset_container_set(B1, x);
            run_container_add(R1, x);
        }
    }

    for (int x = 0; x < (1 << 16); x++) {
        if (x % 62 < 37) {
            array_container_add(A2, x);
            bitset_container_set(B2, x);
            run_container_add(R2, x);
        }
    }

    for (int x = 0; x < (1 << 16); x++)
        if ((x % 5 < 3) && !(x % 62 < 37)) {
            array_container_add(AM, x);
            bitset_container_set(BM, x);
        }

    // the elements x%5 == 2 differ for less than 10k, otherwise same)
    for (int x = 0; x < (1 << 16); x++) {
        if ((x % 5 < 2) || ((x % 5 < 3) && (x > 10000))) {
            array_container_add(A3, x);
            bitset_container_set(B3, x);
            run_container_add(R3, x);
        }
    }

    int randstate = 1;  // for Oakenfull RNG, hope LSBits are nice
    for (int x = 0; x < (1 << 16); x++) {
        if (randstate % 4) {
            run_container_add(R4, x);
            array_container_add(A4, x);
            bitset_container_add(B4, x);
        }
        randstate = (3432 * randstate + 6789) % 9973;
    }

    int cm12 = array_container_cardinality(AM);

    container_t* BM_1 = NULL;

    assert_false(run_bitset_container_andnot(R1, B1, &BM_1));
    assert_int_equal(0, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    array_run_container_andnot(A1, R1, AM);
    assert_int_equal(0, array_container_cardinality(AM));

    // both run coding and array coding have same serialized size for
    // empty
    assert_int_equal(RUN_CONTAINER_TYPE,
                     run_run_container_andnot(R1, R1, &BM_1));
    assert_int_equal(0, run_container_cardinality(CAST_run(BM_1)));
    run_container_free(CAST_run(BM_1));
    BM_1 = NULL;

    assert_false(run_bitset_container_andnot(R1, B3, &BM_1));
    assert_int_equal(2000, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    assert_false(bitset_run_container_andnot(B1, R3, &BM_1));
    assert_int_equal(2000, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    array_run_container_andnot(A1, R3, AM);
    assert_int_equal(2000, array_container_cardinality(AM));

    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     run_array_container_andnot(R1, A3, &BM_1));
    assert_int_equal(2000, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     run_run_container_andnot(R1, R3, &BM_1));
    assert_int_equal(2000, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    assert_true(run_bitset_container_andnot(R1, B2, &BM_1));
    assert_int_equal(cm12, bitset_container_cardinality(CAST_bitset(BM_1)));
    bitset_container_free(CAST_bitset(BM_1));
    BM_1 = NULL;

    array_run_container_andnot(A1, R2, AM);
    assert_int_equal(cm12, array_container_cardinality(AM));

    array_container_t* A_small = array_container_create();
    for (int i = 990; i < 1000; ++i) array_container_add(A_small, i);

    run_container_t* R_small = run_container_create();
    for (int i = 990; i < 1000; ++i) run_container_add(R_small, i);

    array_run_container_andnot(A_small, R2, AM);
    assert_int_equal(2,                                 // something like that
                     array_container_cardinality(AM));  // hopefully right...

    assert_false(run_bitset_container_andnot(R_small, B2, &BM_1));
    assert_int_equal(2, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    // note, result is equally small as an array or a run
    assert_int_equal(RUN_CONTAINER_TYPE,
                     run_array_container_andnot(R_small, A2, &BM_1));
    assert_int_equal(2, run_container_cardinality(CAST_run(BM_1)));
    run_container_free(CAST_run(BM_1));
    BM_1 = NULL;

    // test with more complicated small run structure (to do)
    run_container_t* R_small_complex = run_container_create();
    array_container_t* temp_ac = array_container_create();

    for (int i = 0; i < 3; ++i) run_container_add(R_small_complex, i);
    for (int i = 10; i < 12; ++i) run_container_add(R_small_complex, i);
    for (int i = 990; i < 995; ++i) run_container_add(R_small_complex, i);
    for (int i = 10000; i < 10003; ++i) run_container_add(R_small_complex, i);
    for (int i = 20000; i < 20002; ++i) run_container_add(R_small_complex, i);

    array_container_add(temp_ac, 993);
    array_container_add(temp_ac, 994);
    array_container_add(temp_ac, 2000);

    assert_int_equal(RUN_CONTAINER_TYPE, run_array_container_andnot(
                                             R_small_complex, temp_ac, &BM_1));
    assert_int_equal(13, run_container_cardinality(CAST_run(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    array_container_free(temp_ac);
    run_container_free(R_small_complex);

    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     run_array_container_andnot(R1, A3, &BM_1));
    assert_int_equal(2000, array_container_cardinality(CAST_array(BM_1)));
    array_container_free(CAST_array(BM_1));
    BM_1 = NULL;

    assert_int_equal(BITSET_CONTAINER_TYPE,
                     run_run_container_andnot(R1, R2, &BM_1));
    assert_int_equal(cm12, bitset_container_cardinality(CAST_bitset(BM_1)));
    bitset_container_free(CAST_bitset(BM_1));
    BM_1 = NULL;

    // compute the true card for cont4 - cont3 assuming that
    // bitset-bitset implementation is known correct
    assert_true(bitset_bitset_container_andnot(B4, B3, &BM_1));
    int card_4_3 = bitset_container_cardinality(CAST_bitset(BM_1));
    bitset_container_free(CAST_bitset(BM_1));
    BM_1 = NULL;

    assert_true(run_bitset_container_andnot(R4, B3, &BM_1));
    assert_int_equal(card_4_3, bitset_container_cardinality(CAST_bitset(BM_1)));
    bitset_container_free(CAST_bitset(BM_1));
    BM_1 = NULL;

    array_run_container_andnot(A4, R3, AM);
    // if this fails, either this bitset is wrong or the previous one...
    assert_int_equal(card_4_3, array_container_cardinality(AM));

    assert_int_equal(BITSET_CONTAINER_TYPE,
                     run_run_container_andnot(R4, R3, &BM_1));
    assert_int_equal(card_4_3, bitset_container_cardinality(CAST_bitset(BM_1)));
    bitset_container_free(CAST_bitset(BM_1));
    BM_1 = NULL;

    array_container_free(A1);
    array_container_free(A2);
    array_container_free(A3);
    array_container_free(A4);
    array_container_free(AM);
    array_container_free(A_small);

    bitset_container_free(B1);
    bitset_container_free(B2);
    bitset_container_free(B3);
    bitset_container_free(B4);
    bitset_container_free(BM);

    run_container_free(R1);
    run_container_free(R2);
    run_container_free(R3);
    run_container_free(R4);
    run_container_free(R_small);
}